

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxSequence::Resolve(FxSequence *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  bool bVar4;
  
  if (((this->super_FxExpression).isresolved == false) &&
     ((this->super_FxExpression).isresolved = true,
     (this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0)) {
    bVar4 = false;
    uVar3 = 0;
    do {
      pFVar1 = (this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar3];
      iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
      (this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar3] =
           (FxExpression *)CONCAT44(extraout_var,iVar2);
      if ((FxExpression *)CONCAT44(extraout_var,iVar2) == (FxExpression *)0x0) {
LAB_005364bd:
        bVar4 = true;
      }
      else if ((this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar3]->
               ValueType == &TypeError->super_PType) {
        FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Invalid statement");
        goto LAB_005364bd;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>.Count);
    if (bVar4) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxSequence *)0x0;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxSequence::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	bool fail = false;
	for (unsigned i = 0; i < Expressions.Size(); ++i)
	{
		if (nullptr == (Expressions[i] = Expressions[i]->Resolve(ctx)))
		{
			fail = true;
		}
		else if (Expressions[i]->ValueType == TypeError)
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid statement");
			fail = true;
		}
	}
	if (fail)
	{
		delete this;
		return nullptr;
	}
	return this;
}